

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O0

QpVector * __thiscall Basis::ftran(Basis *this,QpVector *rhs,bool buffer,HighsInt q)

{
  reference pvVar1;
  reference pvVar2;
  byte in_CL;
  HFactor *in_RSI;
  HVector *in_RDI;
  undefined4 in_R8D;
  HighsInt i;
  HVector rhs_hvec;
  undefined4 in_stack_fffffffffffffef0;
  value_type in_stack_fffffffffffffef4;
  HighsTimerClock *in_stack_fffffffffffffef8;
  value_type vVar3;
  HVector *vector;
  QpVector *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int iVar4;
  undefined4 in_stack_ffffffffffffff24;
  HVectorBase<double> *in_stack_ffffffffffffff28;
  HVectorBase<double> *in_stack_ffffffffffffff30;
  HVector *in_stack_ffffffffffffff50;
  Basis *in_stack_ffffffffffffff58;
  byte local_58;
  int local_54;
  vector<int,_std::allocator<int>_> vStack_50;
  vector<double,_std::allocator<double>_> vStack_38;
  undefined4 local_20;
  byte local_19;
  
  local_19 = in_CL & 1;
  vector = in_RDI;
  local_20 = in_R8D;
  vec2hvec((Basis *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
           in_stack_ffffffffffffff18);
  HVectorBase<double>::HVectorBase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  HFactor::ftranCall(in_RSI,vector,(double)in_RDI,in_stack_fffffffffffffef8);
  if ((local_19 & 1) != 0) {
    HVectorBase<double>::copy<double>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    for (iVar4 = 0; iVar4 < local_54; iVar4 = iVar4 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_50,(long)iVar4);
      in_stack_fffffffffffffef4 = *pvVar1;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RSI[1].mwz_column_mark.super__Vector_base<char,_std::allocator<char>_>
                           ._M_impl.field_0x10,(long)iVar4);
      *pvVar1 = in_stack_fffffffffffffef4;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&vStack_38,(long)iVar4);
      vVar3 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RSI[1].mwz_column_array.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)iVar4);
      *pvVar2 = vVar3;
    }
    *(int *)&in_RSI[1].mwz_column_mark.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             field_0xc = local_54;
    in_RSI[1].mwz_column_mark.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 =
         local_58 & 1;
    *(undefined4 *)
     &in_RSI[1].mc_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_20;
  }
  hvec2vec(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  HVectorBase<double>::~HVectorBase
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  return (QpVector *)vector;
}

Assistant:

QpVector Basis::ftran(const QpVector& rhs, bool buffer, HighsInt q) {
  HVector rhs_hvec = vec2hvec(rhs);
  basisfactor.ftranCall(rhs_hvec, 1.0);
  if (buffer) {
    col_aq.copy(&rhs_hvec);
    for (HighsInt i = 0; i < rhs_hvec.packCount; i++) {
      col_aq.packIndex[i] = rhs_hvec.packIndex[i];
      col_aq.packValue[i] = rhs_hvec.packValue[i];
    }
    col_aq.packCount = rhs_hvec.packCount;
    col_aq.packFlag = rhs_hvec.packFlag;
    buffered_q = q;
  }
  return hvec2vec(rhs_hvec);
}